

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O0

bool __thiscall
Assimp::Q3BSPFileImporter::importLightmap
          (Q3BSPFileImporter *this,Q3BSPModel *pModel,aiScene *pScene,aiMaterial *pMatHelper,
          int lightmapId)

{
  uint uVar1;
  size_type sVar2;
  const_reference ppsVar3;
  aiTexture *this_00;
  void *pvVar4;
  undefined1 local_45c [8];
  aiString name;
  size_t i;
  size_t p;
  aiTexture *pTexture;
  sQ3BSPLightmap *pLightMap;
  aiMaterial *paStack_30;
  int lightmapId_local;
  aiMaterial *pMatHelper_local;
  aiScene *pScene_local;
  Q3BSPModel *pModel_local;
  Q3BSPFileImporter *this_local;
  
  if ((((pModel != (Q3BSPModel *)0x0) && (pScene != (aiScene *)0x0)) &&
      (pMatHelper != (aiMaterial *)0x0)) &&
     ((-1 < lightmapId &&
      (pLightMap._4_4_ = lightmapId, paStack_30 = pMatHelper,
      pMatHelper_local = (aiMaterial *)pScene, pScene_local = (aiScene *)pModel,
      pModel_local = (Q3BSPModel *)this,
      sVar2 = std::
              vector<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
              ::size(&pModel->m_Lightmaps), lightmapId < (int)sVar2)))) {
    ppsVar3 = std::
              vector<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
              ::operator[]((vector<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
                            *)&pScene_local[1].mNumMeshes,(long)pLightMap._4_4_);
    pTexture = (aiTexture *)*ppsVar3;
    if (pTexture != (aiTexture *)0x0) {
      this_00 = (aiTexture *)operator_new(0x428);
      aiTexture::aiTexture(this_00);
      this_00->mWidth = 0x80;
      this_00->mHeight = 0x80;
      p = (size_t)this_00;
      pvVar4 = operator_new__(0x10000);
      *(void **)(p + 0x18) = pvVar4;
      memcpy(*(void **)(p + 0x18),pTexture,(ulong)*(uint *)p);
      i = 0;
      name.data[0x3f8] = '\0';
      name.data[0x3f9] = '\0';
      name.data[0x3fa] = '\0';
      name.data[0x3fb] = '\0';
      name.data[0x3fc] = '\0';
      name.data[0x3fd] = '\0';
      name.data[0x3fe] = '\0';
      name.data[0x3ff] = '\0';
      for (; (ulong)name.data._1016_8_ < 0x4000; name.data._1016_8_ = name.data._1016_8_ + 1) {
        *(char *)(*(long *)(p + 0x18) + 2 + name.data._1016_8_ * 4) = pTexture->achFormatHint[i - 8]
        ;
        *(char *)(*(long *)(p + 0x18) + 1 + name.data._1016_8_ * 4) = pTexture->achFormatHint[i - 7]
        ;
        *(char *)(*(long *)(p + 0x18) + name.data._1016_8_ * 4) = pTexture->achFormatHint[i - 6];
        *(undefined1 *)(*(long *)(p + 0x18) + 3 + name.data._1016_8_ * 4) = 0xff;
        i = i + 3;
      }
      aiString::aiString((aiString *)local_45c);
      local_45c[4] = '*';
      sVar2 = std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::size(&this->mTextures);
      uVar1 = ASSIMP_itoa10(local_45c + 5,0x3ff,(int32_t)sVar2);
      local_45c._0_4_ = uVar1 + 1;
      aiMaterial::AddProperty(paStack_30,(aiString *)local_45c,"$tex.file",10,1);
      std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::push_back
                (&this->mTextures,(value_type *)&p);
      return true;
    }
    return false;
  }
  return false;
}

Assistant:

bool Q3BSPFileImporter::importLightmap( const Q3BSP::Q3BSPModel *pModel, aiScene* pScene,
                                       aiMaterial *pMatHelper, int lightmapId )
{
    if (nullptr == pModel || nullptr == pScene || nullptr == pMatHelper ) {
        return false;
    }

    if ( lightmapId < 0 || lightmapId >= static_cast<int>( pModel->m_Lightmaps.size() ) ) {
        return false;
    }

    sQ3BSPLightmap *pLightMap = pModel->m_Lightmaps[ lightmapId ];
    if (nullptr == pLightMap ) {
        return false;
    }

    aiTexture *pTexture = new aiTexture;

    pTexture->mWidth = CE_BSP_LIGHTMAPWIDTH;
    pTexture->mHeight = CE_BSP_LIGHTMAPHEIGHT;
    pTexture->pcData = new aiTexel[CE_BSP_LIGHTMAPWIDTH * CE_BSP_LIGHTMAPHEIGHT];

    ::memcpy( pTexture->pcData, pLightMap->bLMapData, pTexture->mWidth );
    size_t p = 0;
    for ( size_t i = 0; i < CE_BSP_LIGHTMAPWIDTH * CE_BSP_LIGHTMAPHEIGHT; ++i ) {
        pTexture->pcData[ i ].r = pLightMap->bLMapData[ p++ ];
        pTexture->pcData[ i ].g = pLightMap->bLMapData[ p++ ];
        pTexture->pcData[ i ].b = pLightMap->bLMapData[ p++ ];
        pTexture->pcData[ i ].a = 0xFF;
    }

    aiString name;
    name.data[ 0 ] = '*';
    name.length = 1 + ASSIMP_itoa10( name.data + 1, static_cast<unsigned int>(MAXLEN-1), static_cast<int32_t>(mTextures.size()) );

    pMatHelper->AddProperty( &name,AI_MATKEY_TEXTURE_LIGHTMAP( 1 ) );
    mTextures.push_back( pTexture );

    return true;
}